

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::Curiosity::Create
          (Curiosity *this,CuriosityChassisType chassis_type,CuriosityWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> *psVar1;
  double *pdVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _func_int **pp_Var9;
  double dVar10;
  double dVar11;
  long lVar12;
  double *pdVar13;
  ChQuaternion<double> steer_rot;
  undefined4 local_120;
  undefined1 local_119;
  undefined8 local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  _func_int **local_100;
  ChQuaternion<double> local_f8;
  CuriosityWheelType local_cc;
  ChFrame<double> local_c8;
  shared_ptr<chrono::ChMaterialSurface> *local_40;
  CuriosityChassisType local_34;
  
  psVar1 = &this->m_default_material;
  local_c8._vptr_ChFrame = (_func_int **)0x0;
  local_cc = wheel_type;
  local_34 = chassis_type;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityChassis,std::allocator<chrono::curiosity::CuriosityChassis>,char_const(&)[8],chrono::curiosity::CuriosityChassisType&,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8.coord,
             (CuriosityChassis **)&local_c8,
             (allocator<chrono::curiosity::CuriosityChassis> *)&local_f8,(char (*) [8])0x16a4c4,
             &local_34,psVar1);
  dVar10 = local_c8.coord.pos.m_data[0];
  pp_Var9 = local_c8._vptr_ChFrame;
  local_c8._vptr_ChFrame = (_func_int **)0x0;
  local_c8.coord.pos.m_data[0] = 0.0;
  p_Var4 = (this->m_chassis).
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_chassis).
  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var9;
  (this->m_chassis).
  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_40 = psVar1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0]);
  }
  pdVar13 = (double *)&DAT_001833b0;
  lVar12 = 0;
  local_100 = (_func_int **)&PTR__ChFrame_0017db90;
  do {
    local_c8._vptr_ChFrame = local_100;
    local_c8.coord.pos.m_data[0] = pdVar13[-2];
    local_c8.coord.pos.m_data[1] = pdVar13[-1];
    local_c8.coord.pos.m_data[2] = *pdVar13;
    local_c8.coord.rot.m_data[0] = QUNIT;
    local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
    local_c8.coord.rot.m_data[2] = _ChBody;
    local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
    local_f8.m_data[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::curiosity::CuriosityWheel,std::allocator<chrono::curiosity::CuriosityWheel>,char_const(&)[6],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::curiosity::CuriosityWheelType&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
               (CuriosityWheel **)&local_f8,
               (allocator<chrono::curiosity::CuriosityWheel> *)&local_118,(char (*) [6])0x16a4f6,
               &local_c8,&this->m_wheel_material,&local_cc);
    dVar11 = local_f8.m_data[1];
    dVar10 = local_f8.m_data[0];
    local_f8.m_data[0] = 0.0;
    local_f8.m_data[1] = 0.0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->m_wheels)._M_elems[0].
                      super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + lVar12);
    pdVar2 = (double *)
             ((long)&(this->m_wheels)._M_elems[0].
                     super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + lVar12);
    *pdVar2 = dVar10;
    pdVar2[1] = dVar11;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
    }
    pdVar13 = pdVar13 + 3;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x60);
  chrono::Q_from_AngZ(3.141592653589793);
  pp_Var9 = local_100;
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = VNULL;
  local_c8.coord.pos.m_data[1] = _put;
  local_c8.coord.pos.m_data[2] = _UpdateForces;
  local_c8.coord.rot.m_data[0] = local_f8.m_data[0];
  local_c8.coord.rot.m_data[1] = local_f8.m_data[1];
  local_c8.coord.rot.m_data[2] = local_f8.m_data[2];
  local_c8.coord.rot.m_data[3] = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[1].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_c8);
  chrono::Q_from_AngZ(3.141592653589793);
  local_c8._vptr_ChFrame = pp_Var9;
  local_c8.coord.pos.m_data[0] = VNULL;
  local_c8.coord.pos.m_data[1] = _put;
  local_c8.coord.pos.m_data[2] = _UpdateForces;
  local_c8.coord.rot.m_data[0] = local_f8.m_data[0];
  local_c8.coord.rot.m_data[1] = local_f8.m_data[1];
  local_c8.coord.rot.m_data[2] = local_f8.m_data[2];
  local_c8.coord.rot.m_data[3] = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[3].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_c8);
  chrono::Q_from_AngZ(3.141592653589793);
  local_c8._vptr_ChFrame = pp_Var9;
  local_c8.coord.pos.m_data[0] = VNULL;
  local_c8.coord.pos.m_data[1] = _put;
  local_c8.coord.pos.m_data[2] = _UpdateForces;
  local_c8.coord.rot.m_data[0] = local_f8.m_data[0];
  local_c8.coord.rot.m_data[1] = local_f8.m_data[1];
  local_c8.coord.rot.m_data[2] = local_f8.m_data[2];
  local_c8.coord.rot.m_data[3] = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[5].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,&local_c8);
  local_c8._vptr_ChFrame = pp_Var9;
  local_c8.coord.pos.m_data[0] = cr_rel_pos_lf;
  local_c8.coord.pos.m_data[1] = _DAT_00183498;
  local_c8.coord.pos.m_data[2] = _DAT_001834a0;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  psVar1 = local_40;
  local_118 = (CuriosityUpright *)((ulong)local_118._4_4_ << 0x20);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityRocker,std::allocator<chrono::curiosity::CuriosityRocker>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityRocker **)&local_f8,
             (allocator<chrono::curiosity::CuriosityRocker> *)&local_120,(char (*) [9])"rocker_L",
             &local_c8,local_40,(int *)&local_118);
  dVar11 = local_f8.m_data[1];
  dVar10 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var4 = (this->m_rockers)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rockers)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar10;
  (this->m_rockers)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar11;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = cr_rel_pos_rf;
  local_c8.coord.pos.m_data[1] = _DAT_001834b0;
  local_c8.coord.pos.m_data[2] = _DAT_001834b8;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)CONCAT44(local_118._4_4_,1);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityRocker,std::allocator<chrono::curiosity::CuriosityRocker>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityRocker **)&local_f8,
             (allocator<chrono::curiosity::CuriosityRocker> *)&local_120,(char (*) [9])"rocker_R",
             &local_c8,psVar1,(int *)&local_118);
  dVar11 = local_f8.m_data[1];
  dVar10 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var4 = (this->m_rockers)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rockers)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar10;
  (this->m_rockers)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar11;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = cr_rel_pos_lb;
  local_c8.coord.pos.m_data[1] = _DAT_001834c8;
  local_c8.coord.pos.m_data[2] = _DAT_001834d0;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)((ulong)local_118 & 0xffffffff00000000);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityBogie,std::allocator<chrono::curiosity::CuriosityBogie>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityBogie **)&local_f8,(allocator<chrono::curiosity::CuriosityBogie> *)&local_120
             ,(char (*) [8])"bogie_L",&local_c8,psVar1,(int *)&local_118);
  dVar11 = local_f8.m_data[1];
  dVar10 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var4 = (this->m_bogies)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogies)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar10;
  (this->m_bogies)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar11;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = cr_rel_pos_rb;
  local_c8.coord.pos.m_data[1] = _DAT_001834e0;
  local_c8.coord.pos.m_data[2] = _DAT_001834e8;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)CONCAT44(local_118._4_4_,1);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityBogie,std::allocator<chrono::curiosity::CuriosityBogie>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityBogie **)&local_f8,(allocator<chrono::curiosity::CuriosityBogie> *)&local_120
             ,(char (*) [8])"bogie_R",&local_c8,psVar1,(int *)&local_118);
  dVar11 = local_f8.m_data[1];
  dVar10 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var4 = (this->m_bogies)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogies)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar10;
  (this->m_bogies)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar11;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
  }
  local_c8._vptr_ChFrame = (_func_int **)0x0;
  local_c8.coord.pos.m_data[0] = 0.0;
  local_c8.coord.pos.m_data[1] = 3.141592653589793;
  chrono::Q_from_Euler123((ChVector *)&local_f8);
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = sr_rel_pos_lf;
  local_c8.coord.pos.m_data[1] = _DAT_00183438;
  local_c8.coord.pos.m_data[2] = _DAT_00183440;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_FL",&local_c8,psVar1);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar5 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_rocker_uprights)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rocker_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->m_rocker_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = sr_rel_pos_rf;
  local_c8.coord.pos.m_data[1] = _DAT_00183450;
  local_c8.coord.pos.m_data[2] = _DAT_00183458;
  local_c8.coord.rot.m_data[0] = local_f8.m_data[0];
  local_c8.coord.rot.m_data[1] = local_f8.m_data[1];
  local_c8.coord.rot.m_data[2] = local_f8.m_data[2];
  local_c8.coord.rot.m_data[3] = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,&local_f8);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_FR",&local_c8,psVar1);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar5 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_rocker_uprights)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rocker_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->m_rocker_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = sr_rel_pos_lb;
  local_c8.coord.pos.m_data[1] = _DAT_00183468;
  local_c8.coord.pos.m_data[2] = _DAT_00183470;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_RL",&local_c8,psVar1);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar5 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_bogie_uprights)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogie_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->m_bogie_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = sr_rel_pos_rb;
  local_c8.coord.pos.m_data[1] = _DAT_00183480;
  local_c8.coord.pos.m_data[2] = _DAT_00183488;
  local_c8.coord.rot.m_data[0] = local_f8.m_data[0];
  local_c8.coord.rot.m_data[1] = local_f8.m_data[1];
  local_c8.coord.rot.m_data[2] = local_f8.m_data[2];
  local_c8.coord.rot.m_data[3] = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,&local_f8);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_RR",&local_c8,psVar1);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar5 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_bogie_uprights)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogie_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->m_bogie_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = tr_rel_pos_t;
  local_c8.coord.pos.m_data[1] = _DAT_00183528;
  local_c8.coord.pos.m_data[2] = _DAT_00183530;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialBar,std::allocator<chrono::curiosity::CuriosityDifferentialBar>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityDifferentialBar **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialBar> *)&local_120,
             (char (*) [9])"diff bar",&local_c8,psVar1);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar6 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_diff_bar).
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_bar).
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  (this->m_diff_bar).
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = tr_rel_pos_l;
  local_c8.coord.pos.m_data[1] = DAT_001834f8;
  local_c8.coord.pos.m_data[2] = DAT_00183500;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_120 = 0;
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialLink,std::allocator<chrono::curiosity::CuriosityDifferentialLink>,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            (a_Stack_110,(CuriosityDifferentialLink **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialLink> *)&local_119,
             (char (*) [12])"diff link L",&local_c8,psVar1,(int *)&local_120);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar7 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_diff_links)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_links)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar7;
  (this->m_diff_links)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  local_c8._vptr_ChFrame = local_100;
  local_c8.coord.pos.m_data[0] = (double)tr_rel_pos_r;
  local_c8.coord.pos.m_data[1] = DAT_00183510;
  local_c8.coord.pos.m_data[2] = DAT_00183518;
  local_c8.coord.rot.m_data[0] = QUNIT;
  local_c8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_c8.coord.rot.m_data[2] = _ChBody;
  local_c8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_c8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_120 = 1;
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialLink,std::allocator<chrono::curiosity::CuriosityDifferentialLink>,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            (a_Stack_110,(CuriosityDifferentialLink **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialLink> *)&local_119,
             (char (*) [12])"diff link R",&local_c8,psVar1,(int *)&local_120);
  _Var8._M_pi = a_Stack_110[0]._M_pi;
  peVar7 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->m_diff_links)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_links)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar7;
  (this->m_diff_links)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  lVar12 = 0;
  do {
    local_c8._vptr_ChFrame = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8.coord,(ChShaft **)&local_c8,
               (allocator<chrono::ChShaft> *)&local_118);
    dVar10 = local_c8.coord.pos.m_data[0];
    pp_Var9 = local_c8._vptr_ChFrame;
    local_c8._vptr_ChFrame = (_func_int **)0x0;
    local_c8.coord.pos.m_data[0] = 0.0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + lVar12);
    puVar3 = (undefined8 *)
             ((long)&(this->m_drive_shafts)._M_elems[0].
                     super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar12
             );
    *puVar3 = pp_Var9;
    puVar3[1] = dVar10;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0]);
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x60);
  return;
}

Assistant:

void Curiosity::Create(CuriosityChassisType chassis_type, CuriosityWheelType wheel_type) {
    // create rover chassis
    ChQuaternion<> body_rot;
    m_chassis = chrono_types::make_shared<CuriosityChassis>("chassis", chassis_type, m_default_material);

    // Create 6 Curiosity Rover wheels
    for (int i = 0; i < 6; i++) {
        m_wheels[i] = chrono_types::make_shared<CuriosityWheel>("wheel", ChFrame<>(wheel_pos[i], QUNIT),
                                                                m_wheel_material, wheel_type);
    }
    m_wheels[C_RF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RM]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // Create Curiosity suspension rockers and bogies
    m_rockers[0] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_L", ChFrame<>(cr_rel_pos_lf, QUNIT), m_default_material, 0);
    m_rockers[1] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_R", ChFrame<>(cr_rel_pos_rf, QUNIT), m_default_material, 1);

    m_bogies[0] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_L", ChFrame<>(cr_rel_pos_lb, QUNIT), m_default_material, 0);
    m_bogies[1] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_R", ChFrame<>(cr_rel_pos_rb, QUNIT), m_default_material, 1);

    // Create the steering uprights
    ChQuaternion<> steer_rot = Q_from_Euler123(ChVector<double>(0, 0, CH_C_PI));

    m_rocker_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FL", ChFrame<>(sr_rel_pos_lf, QUNIT), m_default_material);
    m_rocker_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FR", ChFrame<>(sr_rel_pos_rf, steer_rot), m_default_material);

    m_bogie_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RL", ChFrame<>(sr_rel_pos_lb, QUNIT), m_default_material);
    m_bogie_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RR", ChFrame<>(sr_rel_pos_rb, steer_rot), m_default_material);

    // Create the differential components
    m_diff_bar = chrono_types::make_shared<CuriosityDifferentialBar>(  //
        "diff bar", ChFrame<>(tr_rel_pos_t, QUNIT), m_default_material);
    m_diff_links[0] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link L", ChFrame<>(tr_rel_pos_l, QUNIT), m_default_material, 0);
    m_diff_links[1] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link R", ChFrame<>(tr_rel_pos_r, QUNIT), m_default_material, 1);

    // Create drive shafts
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}